

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Kinematics.cc
# Opt level: O0

Vector3d *
RigidBodyDynamics::CalcPointAcceleration
          (Model *model,VectorNd *Q,VectorNd *QDot,VectorNd *QDDot,uint body_id,
          Vector3d *point_position,bool update_kinematics)

{
  double dVar1;
  bool bVar2;
  uint body_id_00;
  reference pvVar3;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *other;
  DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *this;
  Scalar *pSVar4;
  Scalar *pSVar5;
  long in_RSI;
  Vector3d *in_RDI;
  uint in_R9D;
  Vector3_t *this_00;
  double *v0;
  byte in_stack_00000010;
  SpatialVector p_a_i;
  Vector3d a_dash;
  SpatialVector p_v_i;
  Model *in_stack_00000120;
  SpatialTransform p_X_i;
  Vector3d base_coords;
  uint fbody_id;
  Vector3d reference_point;
  uint reference_body_id;
  MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_> *in_stack_fffffffffffffd58;
  DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *in_stack_fffffffffffffd60;
  Matrix3d *in_stack_fffffffffffffd68;
  SpatialTransform *in_stack_fffffffffffffd70;
  Model *in_stack_fffffffffffffd78;
  Scalar SVar6;
  double *in_stack_fffffffffffffda0;
  double *in_stack_fffffffffffffda8;
  Vector3_t *in_stack_fffffffffffffdb0;
  undefined1 in_stack_fffffffffffffddb;
  uint in_stack_fffffffffffffddc;
  VectorNd *in_stack_fffffffffffffde0;
  Model *in_stack_fffffffffffffde8;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_stack_fffffffffffffdf0;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_stack_fffffffffffffdf8;
  SpatialVector *in_stack_ffffffffffffff20;
  SpatialTransform *in_stack_ffffffffffffff28;
  undefined1 in_stack_ffffffffffffff6f;
  Vector3d *in_stack_ffffffffffffff70;
  uint in_stack_ffffffffffffff7c;
  VectorNd *in_stack_ffffffffffffff80;
  Model *in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff9f;
  Vector3d *in_stack_ffffffffffffffa0;
  VectorNd *in_stack_ffffffffffffffb0;
  Model *in_stack_ffffffffffffffb8;
  uint local_34;
  
  std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
            ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)(in_RSI + 0x70),
             0);
  Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::setZero
            ((DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)in_stack_fffffffffffffd60);
  std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
            ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)(in_RSI + 0x88),
             0);
  Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::setZero
            ((DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)in_stack_fffffffffffffd60);
  if ((in_stack_00000010 & 1) != 0) {
    UpdateKinematics(in_stack_00000120,
                     (VectorNd *)
                     p_v_i.super_Matrix<double,_6,_1,_0,_6,_1>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                     array[5],(VectorNd *)
                              p_v_i.super_Matrix<double,_6,_1,_0,_6,_1>.
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage
                              .m_data.array[4],
                     (VectorNd *)
                     p_v_i.super_Matrix<double,_6,_1,_0,_6,_1>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                     array[3]);
  }
  Vector3_t::Vector3_t
            ((Vector3_t *)in_stack_fffffffffffffd60,(Vector3_t *)in_stack_fffffffffffffd58);
  bVar2 = Model::IsFixedBodyId
                    (in_stack_fffffffffffffd78,(uint)((ulong)in_stack_fffffffffffffd70 >> 0x20));
  local_34 = in_R9D;
  if (bVar2) {
    body_id_00 = in_R9D - *(int *)(in_RSI + 0x330);
    pvVar3 = std::
             vector<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
             ::operator[]((vector<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
                           *)(in_RSI + 0x318),(ulong)body_id_00);
    local_34 = pvVar3->mMovableParent;
    CalcBodyToBaseCoordinates
              (in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,
               in_stack_ffffffffffffff70,(bool)in_stack_ffffffffffffff6f);
    CalcBaseToBodyCoordinates
              (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,body_id_00,
               in_stack_ffffffffffffffa0,(bool)in_stack_ffffffffffffff9f);
    Vector3_t::operator=
              ((Vector3_t *)in_stack_fffffffffffffd60,(Vector3_t *)in_stack_fffffffffffffd58);
  }
  CalcBodyWorldOrientation
            (in_stack_fffffffffffffde8,in_stack_fffffffffffffde0,in_stack_fffffffffffffddc,
             (bool)in_stack_fffffffffffffddb);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::transpose
            ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_fffffffffffffd58);
  Matrix3_t::Matrix3_t<Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>>
            ((Matrix3_t *)in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
  Math::SpatialTransform::SpatialTransform
            (in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,
             (Vector3d *)in_stack_fffffffffffffd60);
  std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
            ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)(in_RSI + 0x70),
             (ulong)local_34);
  Math::SpatialTransform::apply(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
  other = (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
          Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
                    (in_stack_fffffffffffffd60,(Index)in_stack_fffffffffffffd58);
  this = (DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)
         Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
                   (in_stack_fffffffffffffd60,(Index)other);
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[](this,(Index)other);
  Vector3_t::Vector3_t
            (in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,in_stack_fffffffffffffda0,
             (double *)in_RDI);
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[](this,(Index)other);
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[](this,(Index)other);
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[](this,(Index)other);
  Vector3_t::Vector3_t
            (in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,in_stack_fffffffffffffda0,
             (double *)in_RDI);
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::cross<Eigen::Matrix<double,3,1,0,3,1>>
            (in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0);
  Vector3_t::Vector3_t<Eigen::Matrix<double,3,1,0,3,1>>((Vector3_t *)this,other);
  std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
            ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)(in_RSI + 0x88),
             (ulong)local_34);
  Math::SpatialTransform::apply(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
                     (this,(Index)other);
  SVar6 = *pSVar4;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)this,(Index)other)
  ;
  this_00 = (Vector3_t *)(SVar6 + *pSVar5);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
                     (this,(Index)other);
  dVar1 = *pSVar4;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)this,(Index)other)
  ;
  v0 = (double *)(dVar1 + *pSVar5);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
                     (this,(Index)other);
  dVar1 = *pSVar4;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)this,(Index)other)
  ;
  Vector3_t::Vector3_t(this_00,v0,(double *)(dVar1 + *pSVar5),(double *)in_RDI);
  return in_RDI;
}

Assistant:

RBDL_DLLAPI Vector3d CalcPointAcceleration (
    Model &model,
    const VectorNd &Q,
    const VectorNd &QDot,
    const VectorNd &QDDot,
    unsigned int body_id,
    const Vector3d &point_position,
    bool update_kinematics) {
  LOG << "-------- " << __func__ << " --------" << std::endl;

  // Reset the velocity of the root body
  model.v[0].setZero();
  model.a[0].setZero();

  if (update_kinematics)
    UpdateKinematics (model, Q, QDot, QDDot);

  LOG << std::endl;

  unsigned int reference_body_id = body_id;
  Vector3d reference_point = point_position;

  if (model.IsFixedBodyId(body_id)) {
    unsigned int fbody_id = body_id - model.fixed_body_discriminator;
    reference_body_id = model.mFixedBodies[fbody_id].mMovableParent;
    Vector3d base_coords = 
      CalcBodyToBaseCoordinates (model, Q, body_id, point_position, false);
    reference_point = 
      CalcBaseToBodyCoordinates (model, Q, reference_body_id,base_coords,false);
  }

  SpatialTransform p_X_i (
      CalcBodyWorldOrientation (model, Q, reference_body_id, false).transpose(),
      reference_point);

  SpatialVector p_v_i = p_X_i.apply(model.v[reference_body_id]);
  Vector3d a_dash = Vector3d (p_v_i[0], p_v_i[1], p_v_i[2]
      ).cross(Vector3d (p_v_i[3], p_v_i[4], p_v_i[5]));
  SpatialVector p_a_i = p_X_i.apply(model.a[reference_body_id]);

  return Vector3d (
      p_a_i[3] + a_dash[0],
      p_a_i[4] + a_dash[1],
      p_a_i[5] + a_dash[2]
      );
}